

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop_statement.cpp
# Opt level: O2

void __thiscall duckdb::DropStatement::DropStatement(DropStatement *this)

{
  SQLStatement::SQLStatement(&this->super_SQLStatement,DROP_STATEMENT);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__DropStatement_027933a0;
  make_uniq<duckdb::DropInfo>();
  return;
}

Assistant:

DropStatement::DropStatement() : SQLStatement(StatementType::DROP_STATEMENT), info(make_uniq<DropInfo>()) {
}